

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

group * clipp::operator_(group *__return_storage_ptr__,group *a,group *b)

{
  bool bVar1;
  __type _Var2;
  group *pgVar3;
  group gStack_108;
  group local_c0;
  group local_78;
  
  pgVar3 = &gStack_108;
  if (a->scoped_ == false) {
    bVar1 = group::blocking(a);
    if ((((!bVar1) && (a->exclusive_ == false)) &&
        ((a->super_token<clipp::group>).repeatable_ == false)) && (a->joinable_ == false)) {
      if ((a->super_token<clipp::group>).doc_._M_string_length != 0) {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)b);
        if (!_Var2) goto LAB_00111ed4;
      }
      std::
      vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
      ::emplace_back<clipp::group>(&a->children_,b);
      bVar1 = false;
      pgVar3 = a;
      goto LAB_00111f10;
    }
  }
LAB_00111ed4:
  group::group(&local_78,a);
  group::group(&local_c0,b);
  group::group<clipp::group>(&gStack_108,&local_78,&local_c0);
  bVar1 = true;
  gStack_108.scoped_ = false;
LAB_00111f10:
  group::group(__return_storage_ptr__,pgVar3);
  if (bVar1) {
    group::~group(&gStack_108);
    group::~group(&local_c0);
    group::~group(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

inline group
operator , (group a, group b)
{
    return !a.scoped() && !a.blocking() && !a.exclusive() && !a.repeatable()
        && !a.joinable() && (a.doc().empty() || a.doc() == b.doc())
       ? a.push_back(std::move(b))
       : group{std::move(a), std::move(b)}.scoped(false);
}